

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ray.cpp
# Opt level: O1

string * __thiscall pbrt::Ray::ToString_abi_cxx11_(string *__return_storage_ptr__,Ray *this)

{
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  detail::
  stringPrintfRecursive<pbrt::Point3<float>const&,pbrt::Vector3<float>const&,float_const&,pbrt::MediumHandle_const&>
            (__return_storage_ptr__,"[ o: %s d: %s time: %f, medium: %s ]",&this->o,&this->d,
             &this->time,&this->medium);
  return __return_storage_ptr__;
}

Assistant:

std::string Ray::ToString() const {
    return StringPrintf("[ o: %s d: %s time: %f, medium: %s ]", o, d, time, medium);
}